

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O2

uint64_t __thiscall spvtools::opt::analysis::Constant::GetU64(Constant *this)

{
  uint __line;
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  uint64_t uVar2;
  undefined4 extraout_var_02;
  char *__assertion;
  
  iVar1 = (*this->type_->_vptr_Type[10])();
  if (CONCAT44(extraout_var,iVar1) == 0) {
    __assertion = "type()->AsInteger() != nullptr";
    __line = 0x46;
  }
  else {
    iVar1 = (*this->type_->_vptr_Type[10])();
    if (*(int *)(CONCAT44(extraout_var_00,iVar1) + 0x24) == 0x40) {
      iVar1 = (*this->_vptr_Constant[0xe])(this);
      if ((ScalarConstant *)CONCAT44(extraout_var_01,iVar1) != (ScalarConstant *)0x0) {
        uVar2 = ScalarConstant::GetU64BitValue((ScalarConstant *)CONCAT44(extraout_var_01,iVar1));
        return uVar2;
      }
      iVar1 = (*this->_vptr_Constant[0x16])(this);
      if (CONCAT44(extraout_var_02,iVar1) != 0) {
        return 0;
      }
      __assertion = "AsNullConstant() && \"Must be an integer constant.\"";
      __line = 0x4c;
    }
    else {
      __assertion = "type()->AsInteger()->width() == 64";
      __line = 0x47;
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/constants.cpp"
                ,__line,"uint64_t spvtools::opt::analysis::Constant::GetU64() const");
}

Assistant:

uint64_t Constant::GetU64() const {
  assert(type()->AsInteger() != nullptr);
  assert(type()->AsInteger()->width() == 64);

  if (const IntConstant* ic = AsIntConstant()) {
    return ic->GetU64BitValue();
  } else {
    assert(AsNullConstant() && "Must be an integer constant.");
    return 0u;
  }
}